

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

float Search::action_cost_loss(action a,action *act,float *costs,size_t sz)

{
  size_t i;
  size_t sVar1;
  ostream *poVar2;
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if (act == (action *)0x0) {
    sVar1 = (size_t)(a - 1);
  }
  else {
    sVar1 = 0;
    while( true ) {
      if (sz == sVar1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar2 = std::operator<<(&local_190,"action_cost_loss got action that wasn\'t allowed: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                   ,0xb86,&local_1c0);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (act[sVar1] == a) break;
      sVar1 = sVar1 + 1;
    }
  }
  return costs[sVar1];
}

Assistant:

float action_cost_loss(action a, const action* act, const float* costs, size_t sz)
{
  if (act == nullptr)
    return costs[a - 1];
  for (size_t i = 0; i < sz; i++)
    if (act[i] == a)
      return costs[i];
  THROW("action_cost_loss got action that wasn't allowed: " << a);
}